

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,wstring *wstr)

{
  wchar_t *wstr_00;
  size_t length;
  wstring *wstr_local;
  Message *this_local;
  
  wstr_00 = (wchar_t *)std::__cxx11::wstring::c_str();
  length = std::__cxx11::wstring::length();
  internal::StreamWideCharsToMessage(wstr_00,length,this);
  return this;
}

Assistant:

Message& Message::operator <<(const ::std::wstring& wstr) {
  internal::StreamWideCharsToMessage(wstr.c_str(), wstr.length(), this);
  return *this;
}